

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O2

optional<long_long> __thiscall
yactfr::internal::StrScanner::tryScanConstInt<true,false,long_long,false>(StrScanner *this)

{
  char cVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  ulong extraout_RDX;
  type tVar4;
  
  skipCommentsAndWhitespaces<true,false>(this);
  pcVar2 = this->_at;
  if (pcVar2 != this->_end) {
    cVar1 = *pcVar2;
    this->_at = pcVar2 + 1;
    if (-1 < cVar1) {
      if (cVar1 != '-') {
        this->_at = pcVar2;
      }
      tVar4 = (type)_tryScanConstInt<long_long,10>(this,cVar1 == '-');
      if (((undefined1  [16])tVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (optional<long_long>)tVar4;
      }
      this->_at = pcVar2;
      return (optional<long_long>)tVar4;
    }
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = extraout_RDX;
  return (optional<long_long>)(type)(auVar3 << 0x40);
}

Assistant:

boost::optional<ValT> StrScanner::tryScanConstInt()
{
    static_assert(std::is_same<ValT, long long>::value ||
                  std::is_same<ValT, unsigned long long>::value,
                  "`ValT` is `long long` or `unsigned long long`.");

    this->skipCommentsAndWhitespaces<SkipWsV, SkipCommentsV>();

    const auto at = _at;
    const auto c = this->_scanAnyChar();

    if (c < 0) {
        // nothing left
        return boost::none;
    }

    // check for negation
    const bool negate = (c == '-');

    if (negate && !std::is_signed<ValT>::value) {
        _at = at;
        return boost::none;
    }

    if (!negate) {
        --_at;

        if (AllowPrefixV && c == '+') {
            ++_at;
        }
    }

    // check for radix prefix
    boost::optional<ValT> val;

    if (AllowPrefixV && *_at == '0' && this->charsLeft() >= 2) {
        if (_at[1] == 'b' || _at[1] == 'B' ||
                _at[1] == 'x' || _at[1] == 'X' ||
                (_at[1] >= '1' && _at[1] <= '9')) {
            if (_at[1] == 'b' || _at[1] == 'B') {
                // binary
                _at += 2;
                val = this->_tryScanConstBinInt<ValT>(negate);
            } else if (_at[1] == 'x' || _at[1] == 'X') {
                // hexadecimal
                _at += 2;
                val = this->_tryScanConstInt<ValT, 16>(negate);
            } else {
                // octal: leave prefix to catch 0 too
                assert(_at[1] >= '1' && _at[1] <= '9');
                val = this->_tryScanConstInt<ValT, 8>(negate);
            }

            if (!val) {
                _at = at;
                return boost::none;
            }

            return val;
        }
    }

    // fall back to decimal
    val = this->_tryScanConstInt<ValT, 10>(negate);

    if (!val) {
        // no constant integer
        _at = at;
    }

    return val;
}